

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall
cpplog::ConsoleLogger::logMessage
          (ConsoleLogger *this,Level level,wstring *local,time_point timestamp)

{
  bool bVar1;
  wostream *pwVar2;
  mutex *__mutex;
  undefined7 in_register_00000031;
  Logger *pLVar3;
  string sStack_68;
  wstring local_48;
  
  pLVar3 = (Logger *)CONCAT71(in_register_00000031,level);
  bVar1 = Logger::willBeLogged(&this->super_Logger,level);
  if (bVar1) {
    __mutex = &(this->super_Logger).writeLock;
    std::mutex::lock(__mutex);
    if ((level == SEVERE) || (level == ERROR)) {
      Logger::toString_abi_cxx11_(&local_48,pLVar3,level);
      pwVar2 = std::operator<<((wostream *)&std::wcerr,(wstring *)&local_48);
      pLVar3 = (Logger *)0x106073;
      pwVar2 = std::operator<<(pwVar2," ");
      Logger::toString_abi_cxx11_(&sStack_68,pLVar3,timestamp);
      pwVar2 = operator<<(pwVar2,&sStack_68);
      pwVar2 = std::operator<<(pwVar2,": ");
      std::operator<<(pwVar2,(wstring *)local);
    }
    else {
      Logger::toString_abi_cxx11_(&local_48,pLVar3,level);
      pwVar2 = std::operator<<((wostream *)&std::wcout,(wstring *)&local_48);
      pLVar3 = (Logger *)0x106073;
      pwVar2 = std::operator<<(pwVar2," ");
      Logger::toString_abi_cxx11_(&sStack_68,pLVar3,timestamp);
      pwVar2 = operator<<(pwVar2,&sStack_68);
      pwVar2 = std::operator<<(pwVar2,": ");
      std::operator<<(pwVar2,(wstring *)local);
    }
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void ConsoleLogger::logMessage(Level level, const std::wstring& local, std::chrono::system_clock::time_point timestamp)
{
    if(!willBeLogged(level))
        return;
    std::lock_guard<std::mutex> guard(writeLock);
    if(level == Level::ERROR || level == Level::SEVERE)
        std::wcerr << toString(level) << " " << toString(timestamp) << ": " << local;
    else
        std::wcout << toString(level) << " " << toString(timestamp) << ": " << local;
}